

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple.h
# Opt level: O0

type_conflict * __thiscall
aosoa::NamedTuple<float,_Balance>::get<Balance>(NamedTuple<float,_Balance> *this)

{
  bool match;
  NamedTuple<float,_Balance> *this_local;
  
  return &this->m_attr;
}

Assistant:

typename named_tuple_attribute_type<AttrName, NamedTuple<Type, Name>>::type&
  get() {
    constexpr bool match = std::is_same<AttrName, Name>::value;
    if constexpr (!match) {
      static_assert(match,
                    "Template argument dooes not match any attribute name!");
    } else {
      return m_attr;
    }
  }